

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O3

void __thiscall
PGSStreamReader::setBuffer(PGSStreamReader *this,uint8_t *data,uint32_t dataLen,bool lastBlock)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  ulong __n;
  
  lVar1 = (this->super_AbstractStreamReader).m_tmpBufferLen;
  puVar4 = (this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __n = (ulong)dataLen;
  puVar2 = (this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)puVar2 - (long)puVar4 < (long)(lVar1 + __n)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_tmpBuffer,lVar1 + __n);
    lVar1 = (this->super_AbstractStreamReader).m_tmpBufferLen;
    puVar4 = (this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  if (puVar4 != puVar2) {
    memmove(puVar4 + lVar1,data + 0x8000,__n);
    lVar1 = (this->super_AbstractStreamReader).m_tmpBufferLen;
    puVar4 = (this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  puVar3 = (pointer)0x0;
  if (puVar4 != puVar2) {
    puVar3 = puVar4;
  }
  (this->super_AbstractStreamReader).m_buffer = puVar3;
  (this->super_AbstractStreamReader).m_curPos = puVar3;
  (this->super_AbstractStreamReader).m_bufEnd = puVar3 + lVar1 + __n;
  (this->super_AbstractStreamReader).m_tmpBufferLen = 0;
  return;
}

Assistant:

void PGSStreamReader::setBuffer(uint8_t* data, const uint32_t dataLen, bool lastBlock)
{
    if (m_tmpBufferLen + dataLen > static_cast<int64_t>(m_tmpBuffer.size()))
        m_tmpBuffer.resize(m_tmpBufferLen + dataLen);

    if (!m_tmpBuffer.empty())
        memmove(m_tmpBuffer.data() + m_tmpBufferLen, data + MAX_AV_PACKET_SIZE, dataLen);
    m_tmpBufferLen += dataLen;

    if (!m_tmpBuffer.empty())
        m_curPos = m_buffer = m_tmpBuffer.data();
    else
        m_curPos = m_buffer = nullptr;
    m_bufEnd = m_buffer + m_tmpBufferLen;
    m_tmpBufferLen = 0;
}